

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  xmlNodePtr cur;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlDocPtr doc;
  long lVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  stat buf;
  stat64 sStack_2b8;
  char local_228 [504];
  
  logfile = (FILE *)fopen64("runxmlconf.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    main_cold_1();
  }
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffff,0);
  }
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar8 = nb_errors;
  pcVar7 = "xmlconf";
  if (1 < argc) {
    iVar4 = 1;
    do {
      pcVar1 = argv[iVar4];
      if (*pcVar1 != '-') {
LAB_001027da:
        fprintf(_stderr,"invalid argument: %s\n",pcVar1,pcVar7);
        return 1;
      }
      if ((pcVar1[1] == 'v') && (pcVar1[2] == '\0')) {
        verbose = 1;
      }
      else {
        if ((pcVar1[1] != 'd') || ((pcVar1[2] != '\0' || (iVar4 = iVar4 + 1, argc <= iVar4))))
        goto LAB_001027da;
        pcVar7 = argv[iVar4];
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  snprintf(local_228,500,"%s/xmlconf.xml");
  iVar4 = stat64(local_228,&sStack_2b8);
  if ((iVar4 == -1) || ((sStack_2b8.st_mode & 0xf000) != 0x8000)) {
    main_cold_5();
  }
  else {
    doc = (xmlDocPtr)xmlReadFile(local_228,0,2);
    if (doc == (xmlDocPtr)0x0) {
      main_cold_4();
    }
    else {
      lVar5 = xmlDocGetRootElement(doc);
      if ((lVar5 == 0) ||
         (iVar4 = xmlStrEqual(*(undefined8 *)(lVar5 + 0x10),"TESTSUITE"), iVar4 == 0)) {
        main_cold_3();
      }
      else {
        lVar6 = xmlGetProp(lVar5,"PROFILE");
        if (lVar6 == 0) {
          puts("Test suite");
        }
        else {
          printf("Test suite: %s\n",lVar6);
          (*_xmlFree)(lVar6);
        }
        for (cur = *(xmlNodePtr *)(lVar5 + 0x18); cur != (xmlNodePtr)0x0; cur = cur->next) {
          if (cur->type == XML_ELEMENT_NODE) {
            iVar4 = xmlStrEqual(cur->name,"TESTCASES");
            if (iVar4 == 0) {
              main_cold_2();
            }
            else {
              xmlconfTestCases(doc,cur,1);
            }
          }
        }
      }
      xmlFreeDoc(doc);
    }
  }
  if (nb_leaks == iVar3 && nb_errors == iVar8) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)(nb_leaks - iVar3));
  }
  uVar9 = (ulong)(uint)nb_tests;
  if (nb_errors == 0 && nb_leaks == 0) {
    pcVar7 = "Total %d tests, no errors\n";
  }
  else {
    printf("Total %d tests, %d errors, %d leaks\n",uVar9);
    printf("See %s for detailed output\n","runxmlconf.log");
    iVar8 = 1;
    if ((nb_leaks != 0) || (nb_errors != 0xf)) goto LAB_001027a4;
    pcVar7 = "%d errors were expected\n";
    uVar9 = 0xf;
  }
  iVar8 = 0;
  printf(pcVar7,uVar9);
LAB_001027a4:
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return iVar8;
}

Assistant:

int
main(int argc, char **argv) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;
    const char *dir = "xmlconf";
    int i;

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            verbose = 1;
        } else if (strcmp(argv[i], "-d") == 0 && i + 1 < argc) {
            i += 1;
            dir = argv[i];
        } else {
            fprintf(stderr, "invalid argument: %s\n", argv[i]);
            return 1;
        }
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xmlconfTest(dir);
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
	ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
	printf("See %s for detailed output\n", LOGFILE);
	if ((nb_leaks == 0) && (nb_errors == NB_EXPECTED_ERRORS)) {
	    printf("%d errors were expected\n", nb_errors);
	    ret = 0;
	}
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}